

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picPageAnalyzer.cpp
# Opt level: O0

picPageAnalyzer * __thiscall
picPageAnalyzer::getOriginalPicSourceURL_abi_cxx11_(picPageAnalyzer *this)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  string *in_RSI;
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  int local_c0;
  allocator local_b9;
  int rpos;
  int local_98;
  allocator local_93;
  undefined1 local_92;
  allocator local_91;
  int errpos;
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  string result_middle;
  picPageAnalyzer *this_local;
  string *result;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"Download original",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&errpos,"href=\"",&local_91);
  pageAnalyzer::getInfoFromContent
            ((pageAnalyzer *)local_38,in_RSI,(int)local_58,-1,(string *)0x12,(char)&errpos);
  std::__cxx11::string::~string((string *)&errpos);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_92 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_93);
  std::allocator<char>::~allocator((allocator<char> *)&local_93);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&rpos,"&amp;",&local_b9);
  iVar1 = std::__cxx11::string::find((string *)local_38,(ulong)&rpos);
  std::__cxx11::string::~string((string *)&rpos);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_98 = iVar1;
  while (local_98 != -1) {
    std::__cxx11::string::clear();
    for (local_c0 = 0; local_c0 < local_98; local_c0 = local_c0 + 1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      std::__cxx11::string::operator+=((string *)this,*pcVar2);
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
    std::__cxx11::string::operator+=((string *)this,*pcVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"&amp;",&local_e1);
    iVar1 = std::__cxx11::string::length();
    local_c0 = local_c0 + iVar1;
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    for (; uVar3 = (ulong)local_c0, uVar4 = std::__cxx11::string::length(), uVar3 < uVar4;
        local_c0 = local_c0 + 1) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      std::__cxx11::string::operator+=((string *)this,*pcVar2);
    }
    std::__cxx11::string::operator=((string *)local_38,(string *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"&amp;",&local_109);
    local_98 = std::__cxx11::string::find((string *)local_38,(ulong)local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  local_92 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

std::string picPageAnalyzer::getOriginalPicSourceURL()
{
    std::string result_middle = this->getInfoFromContent(std::string("Download original"), -1, GETMODE_PART, std::string("href=\""), '\"');
    std::string result = std::string("");

    //Part to handle special character "&amp;". It will be replaced by a more uniform function in the future
    int errpos = result_middle.find(std::string("&amp;"));
    while(errpos != std::string::npos)
    {
        result.clear();
        int rpos = 0;
        for(rpos = 0; rpos < errpos; rpos++)
            result += result_middle[rpos];

        result += result_middle[errpos];

        rpos += std::string("&amp;").length();

        for(; rpos < result_middle.length(); rpos++)
            result += result_middle[rpos];

        result_middle = result;

        errpos = result_middle.find(std::string("&amp;"));
    }
    return result;
}